

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O3

Tensor * __thiscall
cnn::SimpleExecutionEngine::get_value(SimpleExecutionEngine *this,VariableIndex *i)

{
  ComputationGraph *pCVar1;
  ulong uVar2;
  
  uVar2 = (ulong)i->t;
  pCVar1 = (this->super_ExecutionEngine).cg;
  if (uVar2 < (ulong)((long)(pCVar1->nodes).
                            super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pCVar1->nodes).
                            super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3)) {
    if ((this->num_nodes_evaluated).t <= i->t) {
      (*(this->super_ExecutionEngine)._vptr_ExecutionEngine[5])(this);
      uVar2 = (ulong)i->t;
    }
    return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start + uVar2;
  }
  __assert_fail("i < cg.nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/exec.cc"
                ,0x1a,"virtual const Tensor &cnn::SimpleExecutionEngine::get_value(VariableIndex)");
}

Assistant:

const Tensor& SimpleExecutionEngine::get_value(VariableIndex i) {
  assert(i < cg.nodes.size());
  if (i >= num_nodes_evaluated) {
    incremental_forward();
  }
  return nfxs[i];
}